

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::LRN_x86_fma::forward_inplace(LRN_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  _func_int **pp_Var1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int *piVar10;
  undefined1 auVar11 [32];
  pointer piVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  Mat *pMVar17;
  _func_int ***ppp_Var18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  float *pfVar22;
  undefined1 (*pauVar23) [32];
  uint uVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  void *pvVar30;
  Mat *pMVar31;
  long lVar32;
  undefined1 (*pauVar33) [32];
  float fVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  allocator_type local_1e9;
  Mat local_1e8;
  Mat *local_198;
  Mat *local_190;
  Mat *local_188;
  Mat *local_180;
  _func_int ***local_178;
  undefined8 local_170;
  Mat local_168;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int iStack_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined1 local_f8 [16];
  long local_e0;
  Allocator *local_d8;
  long local_d0;
  void *local_c8;
  long local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  local_118 = bottom_top_blob->w;
  local_198 = (Mat *)(ulong)(uint)bottom_top_blob->h;
  uVar20 = bottom_top_blob->c;
  pMVar31 = (Mat *)(ulong)uVar20;
  _elemsize = bottom_top_blob->elemsize;
  local_168.cstep = 0;
  local_168.data = (Allocator *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elempack = 0;
  local_168._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  iStack_114 = 0;
  local_168.elemsize._4_4_ = (int)local_168.refcount;
  local_168.allocator = (Allocator *)local_168.data;
  local_168.dims = (int)local_168.refcount;
  local_168.w = local_168.refcount._4_4_;
  local_168.c = local_168.elempack;
  Mat::create(&local_168,local_118,bottom_top_blob->h,uVar20,_elemsize,opt->workspace_allocator);
  iVar15 = -100;
  if (((Allocator *)local_168.data == (Allocator *)0x0) ||
     ((long)local_168.c * local_168.cstep == 0)) goto LAB_00345ee1;
  uVar24 = (int)local_198 * local_118;
  if (0 < (int)uVar20) {
    pMVar17 = (Mat *)0x0;
    do {
      pfVar22 = (float *)(bottom_top_blob->cstep * (long)pMVar17 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var18 = (_func_int ***)
                  ((long)(_func_int ***)local_168.data +
                  local_168.cstep * (long)pMVar17 *
                  CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
      if ((int)uVar24 < 8) {
        uVar14 = 0;
      }
      else {
        iVar26 = 7;
        do {
          auVar2._4_4_ = pfVar22[1] * pfVar22[1];
          auVar2._0_4_ = *pfVar22 * *pfVar22;
          auVar2._8_4_ = pfVar22[2] * pfVar22[2];
          auVar2._12_4_ = pfVar22[3] * pfVar22[3];
          auVar2._16_4_ = pfVar22[4] * pfVar22[4];
          auVar2._20_4_ = pfVar22[5] * pfVar22[5];
          auVar2._24_4_ = pfVar22[6] * pfVar22[6];
          auVar2._28_4_ = pfVar22[7];
          *(undefined1 (*) [32])ppp_Var18 = auVar2;
          pfVar22 = pfVar22 + 8;
          ppp_Var18 = ppp_Var18 + 4;
          iVar26 = iVar26 + 8;
          uVar14 = uVar24 & 0xfffffff8;
        } while (iVar26 < (int)uVar24);
      }
      if (uVar24 - uVar14 != 0 && (int)uVar14 <= (int)uVar24) {
        lVar29 = 0;
        do {
          *(float *)((long)ppp_Var18 + lVar29 * 4) = pfVar22[lVar29] * pfVar22[lVar29];
          lVar29 = lVar29 + 1;
        } while (uVar24 - uVar14 != (int)lVar29);
      }
      pMVar17 = (Mat *)((long)&pMVar17->data + 1);
    } while (pMVar17 != pMVar31);
  }
  local_188 = pMVar31;
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_fma[-3]) == 0) {
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    Mat::create(&local_1e8,local_118,(int)local_198,uVar20,_elemsize,opt->workspace_allocator);
    bVar13 = local_1e8.data == (void *)0x0 || (long)local_1e8.c * local_1e8.cstep == 0;
    if (bVar13) {
      piVar10 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      goto LAB_00345ee1;
    }
    local_178 = (_func_int ***)CONCAT71(local_178._1_7_,bVar13);
    local_198 = bottom_top_blob;
    if (0 < local_1e8.c * (int)local_1e8.cstep) {
      memset(local_1e8.data,0,(ulong)(uint)(local_1e8.c * (int)local_1e8.cstep) << 2);
    }
    if (0 < (int)uVar20) {
      local_f8 = ZEXT416((uint)(*(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_fma[-3]) /
                               (float)*(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_fma[-3]
                                              )));
      auVar65 = ZEXT1664(local_f8);
      pp_Var1 = this->_vptr_LRN_x86_fma;
      auVar38 = vshufps_avx(local_f8,local_f8,0);
      local_b8._16_16_ = auVar38;
      local_b8._0_16_ = auVar38;
      pMVar17 = (Mat *)0x0;
      local_170 = CONCAT44(local_170._4_4_,uVar24) & 0xfffffffffffffff8;
      uVar20 = uVar24 & 0xfffffff8;
      do {
        auVar69._8_4_ = 0x3f000000;
        auVar69._0_8_ = 0x3f0000003f000000;
        auVar68._8_4_ = 0x3d9021bb;
        auVar68._0_8_ = 0x3d9021bb3d9021bb;
        auVar47._8_4_ = 0xbdebd1b8;
        auVar47._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar69._12_4_ = 0x3f000000;
        auVar68._12_4_ = 0x3d9021bb;
        auVar47._12_4_ = 0xbdebd1b8;
        auVar69._16_4_ = 0x3f000000;
        auVar68._16_4_ = 0x3d9021bb;
        auVar47._16_4_ = 0xbdebd1b8;
        auVar69._20_4_ = 0x3f000000;
        auVar68._20_4_ = 0x3d9021bb;
        auVar47._20_4_ = 0xbdebd1b8;
        auVar69._24_4_ = 0x3f000000;
        auVar68._24_4_ = 0x3d9021bb;
        auVar47._24_4_ = 0xbdebd1b8;
        auVar69._28_4_ = 0x3f000000;
        auVar68._28_4_ = 0x3d9021bb;
        auVar47._28_4_ = 0xbdebd1b8;
        iVar15 = *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]) / 2;
        iVar26 = (int)pMVar17;
        uVar14 = iVar26 - iVar15;
        if ((int)uVar14 <= iVar15 + iVar26) {
          do {
            if (uVar14 < (uint)pMVar31) {
              ppp_Var18 = (_func_int ***)
                          ((long)(_func_int ***)local_168.data +
                          uVar14 * local_168.cstep *
                          CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
              pauVar23 = (undefined1 (*) [32])
                         (local_1e8.cstep * (long)pMVar17 *
                          CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) +
                         (long)local_1e8.data);
              uVar27 = 0;
              if (7 < (int)uVar24) {
                iVar15 = 7;
                do {
                  auVar35._0_4_ = *(float *)*pauVar23 + *(float *)ppp_Var18;
                  auVar35._4_4_ = *(float *)(*pauVar23 + 4) + *(float *)((long)ppp_Var18 + 4);
                  auVar35._8_4_ = *(float *)(*pauVar23 + 8) + *(float *)(ppp_Var18 + 1);
                  auVar35._12_4_ =
                       *(float *)(*pauVar23 + 0xc) + *(float *)((long)(ppp_Var18 + 1) + 4);
                  auVar35._16_4_ = *(float *)(*pauVar23 + 0x10) + *(float *)(ppp_Var18 + 2);
                  auVar35._20_4_ =
                       *(float *)(*pauVar23 + 0x14) + *(float *)((long)(ppp_Var18 + 2) + 4);
                  auVar35._24_4_ = *(float *)(*pauVar23 + 0x18) + *(float *)(ppp_Var18 + 3);
                  auVar35._28_4_ =
                       *(float *)(*pauVar23 + 0x1c) + *(float *)((long)(ppp_Var18 + 3) + 4);
                  *pauVar23 = auVar35;
                  ppp_Var18 = ppp_Var18 + 4;
                  pauVar23 = pauVar23 + 1;
                  iVar15 = iVar15 + 8;
                  uVar27 = uVar20;
                } while (iVar15 < (int)uVar24);
              }
              if (uVar24 - uVar27 != 0 && (int)uVar27 <= (int)uVar24) {
                lVar29 = 0;
                do {
                  *(float *)(*pauVar23 + lVar29 * 4) =
                       *(float *)(*pauVar23 + lVar29 * 4) + *(float *)((long)ppp_Var18 + lVar29 * 4)
                  ;
                  lVar29 = lVar29 + 1;
                } while (uVar24 - uVar27 != (int)lVar29);
              }
            }
            bVar13 = (int)uVar14 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]) / 2 + iVar26;
            uVar14 = uVar14 + 1;
          } while (bVar13);
        }
        pauVar23 = (undefined1 (*) [32])
                   (local_198->cstep * (long)pMVar17 * local_198->elemsize + (long)local_198->data);
        pauVar33 = (undefined1 (*) [32])
                   (local_1e8.cstep * (long)pMVar17 *
                    CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) +
                   (long)local_1e8.data);
        uVar14 = 0;
        if (7 < (int)uVar24) {
          local_118 = *(int *)(&this->field_0xe0 + (long)pp_Var1[-3]);
          fVar34 = *(float *)(&this->field_0xdc + (long)pp_Var1[-3]);
          auVar38._0_8_ = CONCAT44(fVar34,fVar34) ^ 0x8000000080000000;
          auVar38._8_4_ = -fVar34;
          auVar38._12_4_ = -fVar34;
          auVar36._16_16_ = auVar38;
          auVar36._0_16_ = auVar38;
          iVar15 = 7;
          auVar37._8_4_ = 0xb95e8083;
          auVar37._0_8_ = 0xb95e8083b95e8083;
          auVar37._12_4_ = 0xb95e8083;
          auVar37._16_4_ = 0xb95e8083;
          auVar37._20_4_ = 0xb95e8083;
          auVar37._24_4_ = 0xb95e8083;
          auVar37._28_4_ = 0xb95e8083;
          auVar66._8_4_ = 0x3f318000;
          auVar66._0_8_ = 0x3f3180003f318000;
          auVar66._12_4_ = 0x3f318000;
          auVar66._16_4_ = 0x3f318000;
          auVar66._20_4_ = 0x3f318000;
          auVar66._24_4_ = 0x3f318000;
          auVar66._28_4_ = 0x3f318000;
          auVar39._8_4_ = 0xffffff81;
          auVar39._0_8_ = 0xffffff81ffffff81;
          auVar39._12_4_ = 0xffffff81;
          auVar67._8_4_ = 0x3f800000;
          auVar67._0_8_ = 0x3f8000003f800000;
          auVar67._12_4_ = 0x3f800000;
          do {
            auVar11._4_4_ = local_118;
            auVar11._0_4_ = local_118;
            auVar11._8_4_ = local_118;
            auVar11._12_4_ = local_118;
            auVar11._16_4_ = local_118;
            auVar11._20_4_ = local_118;
            auVar11._24_4_ = local_118;
            auVar11._28_4_ = local_118;
            auVar5 = vfmadd132ps_fma(*pauVar33,auVar11,local_b8);
            auVar41._8_4_ = 0x800000;
            auVar41._0_8_ = 0x80000000800000;
            auVar41._12_4_ = 0x800000;
            auVar41._16_4_ = 0x800000;
            auVar41._20_4_ = 0x800000;
            auVar41._24_4_ = 0x800000;
            auVar41._28_4_ = 0x800000;
            auVar3 = vmaxps_avx(ZEXT1632(auVar5),auVar41);
            auVar46 = vpsrld_avx(auVar3._0_16_,0x17);
            auVar50._8_4_ = 0x807fffff;
            auVar50._0_8_ = 0x807fffff807fffff;
            auVar50._12_4_ = 0x807fffff;
            auVar50._16_4_ = 0x807fffff;
            auVar50._20_4_ = 0x807fffff;
            auVar50._24_4_ = 0x807fffff;
            auVar50._28_4_ = 0x807fffff;
            auVar2 = vandps_avx(auVar3,auVar50);
            auVar4 = vorps_avx(auVar69,auVar2);
            auVar54._8_4_ = 0x3f3504f3;
            auVar54._0_8_ = 0x3f3504f33f3504f3;
            auVar54._12_4_ = 0x3f3504f3;
            auVar54._16_4_ = 0x3f3504f3;
            auVar54._20_4_ = 0x3f3504f3;
            auVar54._24_4_ = 0x3f3504f3;
            auVar54._28_4_ = 0x3f3504f3;
            auVar35 = vcmpps_avx(auVar54,auVar4,2);
            auVar2 = vandnps_avx(auVar35,auVar4);
            auVar61 = vpsrld_avx(auVar3._16_16_,0x17);
            auVar42._0_4_ = auVar4._0_4_ + -1.0 + auVar2._0_4_;
            auVar42._4_4_ = auVar4._4_4_ + -1.0 + auVar2._4_4_;
            auVar42._8_4_ = auVar4._8_4_ + -1.0 + auVar2._8_4_;
            auVar42._12_4_ = auVar4._12_4_ + -1.0 + auVar2._12_4_;
            auVar42._16_4_ = auVar4._16_4_ + -1.0 + auVar2._16_4_;
            auVar42._20_4_ = auVar4._20_4_ + -1.0 + auVar2._20_4_;
            auVar42._24_4_ = auVar4._24_4_ + -1.0 + auVar2._24_4_;
            auVar42._28_4_ = auVar4._28_4_ + -1.0 + auVar2._28_4_;
            auVar46 = vpsubd_avx(auVar46,auVar35._0_16_);
            auVar61 = vpsubd_avx(auVar61,auVar35._16_16_);
            auVar46 = vpaddd_avx(auVar46,auVar39);
            auVar6 = vfmadd213ps_fma(auVar68,auVar42,auVar47);
            auVar61 = vpaddd_avx(auVar61,auVar39);
            auVar58._8_4_ = 0x3def251a;
            auVar58._0_8_ = 0x3def251a3def251a;
            auVar58._12_4_ = 0x3def251a;
            auVar58._16_4_ = 0x3def251a;
            auVar58._20_4_ = 0x3def251a;
            auVar58._24_4_ = 0x3def251a;
            auVar58._28_4_ = 0x3def251a;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42,auVar58);
            auVar59._8_4_ = 0xbdfe5d4f;
            auVar59._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar59._12_4_ = 0xbdfe5d4f;
            auVar59._16_4_ = 0xbdfe5d4f;
            auVar59._20_4_ = 0xbdfe5d4f;
            auVar59._24_4_ = 0xbdfe5d4f;
            auVar59._28_4_ = 0xbdfe5d4f;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42,auVar59);
            auVar60._8_4_ = 0x3e11e9bf;
            auVar60._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar60._12_4_ = 0x3e11e9bf;
            auVar60._16_4_ = 0x3e11e9bf;
            auVar60._20_4_ = 0x3e11e9bf;
            auVar60._24_4_ = 0x3e11e9bf;
            auVar60._28_4_ = 0x3e11e9bf;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42,auVar60);
            auVar3._4_4_ = auVar42._4_4_ * auVar42._4_4_;
            auVar3._0_4_ = auVar42._0_4_ * auVar42._0_4_;
            auVar3._8_4_ = auVar42._8_4_ * auVar42._8_4_;
            auVar3._12_4_ = auVar42._12_4_ * auVar42._12_4_;
            auVar3._16_4_ = auVar42._16_4_ * auVar42._16_4_;
            auVar3._20_4_ = auVar42._20_4_ * auVar42._20_4_;
            auVar3._24_4_ = auVar42._24_4_ * auVar42._24_4_;
            auVar3._28_4_ = 0x3e11e9bf;
            auVar62._8_4_ = 0xbe2aae50;
            auVar62._0_8_ = 0xbe2aae50be2aae50;
            auVar62._12_4_ = 0xbe2aae50;
            auVar62._16_4_ = 0xbe2aae50;
            auVar62._20_4_ = 0xbe2aae50;
            auVar62._24_4_ = 0xbe2aae50;
            auVar62._28_4_ = 0xbe2aae50;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42,auVar62);
            auVar63._8_4_ = 0x3e4cceac;
            auVar63._0_8_ = 0x3e4cceac3e4cceac;
            auVar63._12_4_ = 0x3e4cceac;
            auVar63._16_4_ = 0x3e4cceac;
            auVar63._20_4_ = 0x3e4cceac;
            auVar63._24_4_ = 0x3e4cceac;
            auVar63._28_4_ = 0x3e4cceac;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42,auVar63);
            auVar64._8_4_ = 0xbe7ffffc;
            auVar64._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar64._12_4_ = 0xbe7ffffc;
            auVar64._16_4_ = 0xbe7ffffc;
            auVar64._20_4_ = 0xbe7ffffc;
            auVar64._24_4_ = 0xbe7ffffc;
            auVar64._28_4_ = 0xbe7ffffc;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42,auVar64);
            auVar48._16_16_ = auVar61;
            auVar48._0_16_ = auVar46;
            auVar51._8_4_ = 0x3eaaaaaa;
            auVar51._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar51._12_4_ = 0x3eaaaaaa;
            auVar51._16_4_ = 0x3eaaaaaa;
            auVar51._20_4_ = 0x3eaaaaaa;
            auVar51._24_4_ = 0x3eaaaaaa;
            auVar51._28_4_ = 0x3eaaaaaa;
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar42,auVar51);
            auVar4._4_4_ = auVar42._4_4_ * auVar42._4_4_ * auVar42._4_4_ * auVar46._4_4_;
            auVar4._0_4_ = auVar42._0_4_ * auVar42._0_4_ * auVar42._0_4_ * auVar46._0_4_;
            auVar4._8_4_ = auVar42._8_4_ * auVar42._8_4_ * auVar42._8_4_ * auVar46._8_4_;
            auVar4._12_4_ = auVar42._12_4_ * auVar42._12_4_ * auVar42._12_4_ * auVar46._12_4_;
            auVar4._16_4_ = auVar42._16_4_ * auVar42._16_4_ * auVar42._16_4_ * 0.0;
            auVar4._20_4_ = auVar42._20_4_ * auVar42._20_4_ * auVar42._20_4_ * 0.0;
            auVar4._24_4_ = auVar42._24_4_ * auVar42._24_4_ * auVar42._24_4_ * 0.0;
            auVar4._28_4_ = 0x3eaaaaaa;
            auVar35 = vcvtdq2ps_avx(auVar48);
            auVar46 = vfmadd231ps_fma(auVar4,auVar35,auVar37);
            auVar46 = vfmsub231ps_fma(ZEXT1632(auVar46),auVar69,auVar3);
            auVar3 = vsubps_avx(ZEXT1632(auVar46),auVar42);
            auVar2 = vcmpps_avx(ZEXT1632(auVar5),_DAT_0054d2a0,2);
            auVar46 = vfmsub231ps_fma(auVar3,auVar66,auVar35);
            auVar2 = vorps_avx(auVar2,ZEXT1632(auVar46));
            local_98._0_4_ = (undefined4)auVar38._0_8_;
            local_98._4_4_ = (undefined4)(auVar38._0_8_ >> 0x20);
            auVar7._4_4_ = auVar2._4_4_ * (float)local_98._4_4_;
            auVar7._0_4_ = auVar2._0_4_ * (float)local_98._0_4_;
            auVar7._8_4_ = auVar2._8_4_ * auVar38._8_4_;
            auVar7._12_4_ = auVar2._12_4_ * auVar38._12_4_;
            auVar7._16_4_ = auVar2._16_4_ * (float)local_98._0_4_;
            auVar7._20_4_ = auVar2._20_4_ * (float)local_98._4_4_;
            auVar7._24_4_ = auVar2._24_4_ * auVar38._8_4_;
            auVar7._28_4_ = auVar2._28_4_;
            auVar43._8_4_ = 0x42b0c0a5;
            auVar43._0_8_ = 0x42b0c0a542b0c0a5;
            auVar43._12_4_ = 0x42b0c0a5;
            auVar43._16_4_ = 0x42b0c0a5;
            auVar43._20_4_ = 0x42b0c0a5;
            auVar43._24_4_ = 0x42b0c0a5;
            auVar43._28_4_ = 0x42b0c0a5;
            auVar2 = vminps_avx(auVar7,auVar43);
            auVar44._8_4_ = 0xc2b0c0a5;
            auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar44._12_4_ = 0xc2b0c0a5;
            auVar44._16_4_ = 0xc2b0c0a5;
            auVar44._20_4_ = 0xc2b0c0a5;
            auVar44._24_4_ = 0xc2b0c0a5;
            auVar44._28_4_ = 0xc2b0c0a5;
            auVar35 = vmaxps_avx(auVar2,auVar44);
            auVar45._8_4_ = 0x3fb8aa3b;
            auVar45._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar45._12_4_ = 0x3fb8aa3b;
            auVar45._16_4_ = 0x3fb8aa3b;
            auVar45._20_4_ = 0x3fb8aa3b;
            auVar45._24_4_ = 0x3fb8aa3b;
            auVar45._28_4_ = 0x3fb8aa3b;
            auVar46 = vfmadd213ps_fma(auVar45,auVar35,auVar69);
            auVar3 = vroundps_avx(ZEXT1632(auVar46),1);
            auVar2 = vcmpps_avx(ZEXT1632(auVar46),auVar3,1);
            auVar52._8_4_ = 0x3f800000;
            auVar52._0_8_ = 0x3f8000003f800000;
            auVar52._12_4_ = 0x3f800000;
            auVar52._16_4_ = 0x3f800000;
            auVar52._20_4_ = 0x3f800000;
            auVar52._24_4_ = 0x3f800000;
            auVar52._28_4_ = 0x3f800000;
            auVar2 = vandps_avx(auVar2,auVar52);
            auVar2 = vsubps_avx(auVar3,auVar2);
            auVar46 = vfmsub231ps_fma(auVar35,auVar2,auVar66);
            auVar61 = vfnmsub231ps_fma(ZEXT1632(auVar46),auVar2,auVar37);
            auVar49._8_4_ = 0x39506967;
            auVar49._0_8_ = 0x3950696739506967;
            auVar49._12_4_ = 0x39506967;
            auVar49._16_4_ = 0x39506967;
            auVar49._20_4_ = 0x39506967;
            auVar49._24_4_ = 0x39506967;
            auVar49._28_4_ = 0x39506967;
            auVar53._8_4_ = 0x3ab743ce;
            auVar53._0_8_ = 0x3ab743ce3ab743ce;
            auVar53._12_4_ = 0x3ab743ce;
            auVar53._16_4_ = 0x3ab743ce;
            auVar53._20_4_ = 0x3ab743ce;
            auVar53._24_4_ = 0x3ab743ce;
            auVar53._28_4_ = 0x3ab743ce;
            auVar46 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar61),auVar53);
            auVar8._28_4_ = 0x3ab743ce;
            auVar8._0_28_ =
                 ZEXT1628(CONCAT412(auVar61._12_4_ * auVar61._12_4_,
                                    CONCAT48(auVar61._8_4_ * auVar61._8_4_,
                                             CONCAT44(auVar61._4_4_ * auVar61._4_4_,
                                                      auVar61._0_4_ * auVar61._0_4_))));
            auVar55._8_4_ = 0x3c088908;
            auVar55._0_8_ = 0x3c0889083c088908;
            auVar55._12_4_ = 0x3c088908;
            auVar55._16_4_ = 0x3c088908;
            auVar55._20_4_ = 0x3c088908;
            auVar55._24_4_ = 0x3c088908;
            auVar55._28_4_ = 0x3c088908;
            auVar35 = ZEXT1632(auVar61);
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar55);
            auVar56._8_4_ = 0x3d2aa9c1;
            auVar56._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar56._12_4_ = 0x3d2aa9c1;
            auVar56._16_4_ = 0x3d2aa9c1;
            auVar56._20_4_ = 0x3d2aa9c1;
            auVar56._24_4_ = 0x3d2aa9c1;
            auVar56._28_4_ = 0x3d2aa9c1;
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar56);
            auVar57._8_4_ = 0x3e2aaaaa;
            auVar57._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar57._12_4_ = 0x3e2aaaaa;
            auVar57._16_4_ = 0x3e2aaaaa;
            auVar57._20_4_ = 0x3e2aaaaa;
            auVar57._24_4_ = 0x3e2aaaaa;
            auVar57._28_4_ = 0x3e2aaaaa;
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar57);
            auVar46 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar35,auVar69);
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar46),auVar8,auVar35);
            auVar46._0_4_ = (int)auVar2._0_4_;
            auVar46._4_4_ = (int)auVar2._4_4_;
            auVar46._8_4_ = (int)auVar2._8_4_;
            auVar46._12_4_ = (int)auVar2._12_4_;
            auVar40._16_4_ = (int)auVar2._16_4_;
            auVar40._0_16_ = auVar46;
            auVar40._20_4_ = (int)auVar2._20_4_;
            auVar40._24_4_ = (int)auVar2._24_4_;
            auVar40._28_4_ = (int)auVar2._28_4_;
            auVar61 = vpslld_avx(auVar46,0x17);
            auVar46 = vpslld_avx(auVar40._16_16_,0x17);
            auVar46 = vpaddd_avx(auVar67,auVar46);
            auVar61 = vpaddd_avx(auVar67,auVar61);
            auVar9._4_4_ = auVar61._4_4_ * *(float *)((long)*pauVar23 + 4);
            auVar9._0_4_ = auVar61._0_4_ * *(float *)*pauVar23;
            auVar9._8_4_ = auVar61._8_4_ * *(float *)((long)*pauVar23 + 8);
            auVar9._12_4_ = auVar61._12_4_ * *(float *)((long)*pauVar23 + 0xc);
            auVar9._16_4_ = auVar46._0_4_ * *(float *)((long)*pauVar23 + 0x10);
            auVar9._20_4_ = auVar46._4_4_ * *(float *)((long)*pauVar23 + 0x14);
            auVar9._24_4_ = auVar46._8_4_ * *(float *)((long)*pauVar23 + 0x18);
            auVar9._28_4_ = auVar46._12_4_;
            auVar46 = vfmadd213ps_fma(auVar9,ZEXT1632(auVar5),auVar9);
            *pauVar23 = ZEXT1632(auVar46);
            pauVar33 = pauVar33 + 1;
            pauVar23 = pauVar23 + 1;
            iVar15 = iVar15 + 8;
            uVar14 = uVar20;
            iStack_114 = local_118;
            iStack_110 = local_118;
            iStack_10c = local_118;
            iStack_108 = local_118;
            iStack_104 = local_118;
            iStack_100 = local_118;
            iStack_fc = local_118;
            local_98 = auVar36;
          } while (iVar15 < (int)uVar24);
        }
        local_190 = pMVar17;
        if (uVar24 - uVar14 != 0 && (int)uVar14 <= (int)uVar24) {
          lVar29 = 0;
          do {
            auVar38 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar33 + lVar29 * 4)),auVar65._0_16_,
                                      ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var1[-3])));
            fVar34 = powf(auVar38._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var1[-3]));
            auVar65 = ZEXT1664(local_f8);
            *(float *)((long)*pauVar23 + lVar29 * 4) =
                 fVar34 * *(float *)((long)*pauVar23 + lVar29 * 4);
            lVar29 = lVar29 + 1;
          } while (uVar24 - uVar14 != (int)lVar29);
        }
        pMVar17 = (Mat *)((long)&local_190->data + 1);
        pMVar31 = local_188;
        uVar20 = (uint)local_170;
      } while (pMVar17 != local_188);
    }
    piVar10 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
    iVar15 = -100;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    if ((char)local_178 != '\0') goto LAB_00345ee1;
  }
  else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86_fma[-3]) == 1) {
    piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
    local_1e8.data = local_168.data;
    local_1e8.refcount._0_4_ = (int)local_168.refcount;
    local_1e8.refcount._4_4_ = local_168.refcount._4_4_;
    local_1e8.elemsize._0_4_ = (undefined4)local_168.elemsize;
    local_1e8.elemsize._4_4_ = local_168.elemsize._4_4_;
    local_1e8.elempack = local_168.elempack;
    local_1e8.allocator = local_168.allocator;
    local_1e8.dims = local_168.dims;
    local_1e8.w = local_168.w;
    local_1e8.h = local_168.h;
    local_1e8.d = local_168.d;
    local_1e8.c = local_168.c;
    local_1e8.cstep = local_168.cstep;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    iVar26 = local_118;
    if (1 < (int)*(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_fma[-3])) {
      uVar20 = *(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_fma[-3]) >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar26 = ~uVar20 + *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_fma[-3]);
      copy_make_border(&local_168,&local_1e8,uVar20,iVar26,uVar20,iVar26,0,0.0,(Option *)&_space_ofs
                      );
      iVar26 = local_1e8.w;
      if ((Allocator *)local_1e8.data == (Allocator *)0x0 ||
          (long)local_1e8.c * local_1e8.cstep == 0) {
        piVar10 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (local_1e8.allocator == (Allocator *)0x0) {
              if ((Allocator *)local_1e8.data != (Allocator *)0x0) {
                free(local_1e8.data);
              }
            }
            else {
              (*(local_1e8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_1e8.cstep = 0;
        local_1e8.data = (void *)0x0;
        local_1e8.refcount._0_4_ = 0;
        local_1e8.refcount._4_4_ = 0;
        local_1e8.elemsize._0_4_ = 0;
        local_1e8.elemsize._4_4_ = 0;
        local_1e8.elempack = 0;
        local_1e8.dims = 0;
        local_1e8.w = 0;
        local_1e8.h = 0;
        local_1e8.d = 0;
        local_1e8.c = 0;
        goto LAB_00345ee1;
      }
    }
    iVar15 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_fma[-3]);
    local_98._0_4_ = iVar15;
    uVar20 = iVar15 * iVar15;
    local_f8._0_4_ = *(undefined4 *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_fma[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar20,&local_1e9);
    piVar12 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pp_Var1 = this->_vptr_LRN_x86_fma;
    iVar15 = *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]);
    if (0 < iVar15) {
      iVar16 = 0;
      iVar21 = 0;
      iVar25 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3])) {
          lVar29 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar25 + lVar29] = iVar21 + (int)lVar29;
            lVar29 = lVar29 + 1;
            iVar28 = (int)lVar29;
          } while (iVar28 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]));
          iVar25 = iVar25 + iVar28;
          iVar21 = iVar21 + iVar28;
        }
        iVar21 = iVar21 + (iVar26 - iVar15);
        iVar16 = iVar16 + 1;
      } while (iVar16 < *(int *)(&this->field_0xd4 + (long)pp_Var1[-3]));
    }
    if (0 < (int)local_188) {
      local_170 = (ulong)local_118;
      local_c8 = bottom_top_blob->data;
      local_d0 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_d8 = (Allocator *)local_1e8.data;
      local_e0 = local_1e8.cstep * CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize)
      ;
      local_c0 = (long)local_1e8.w *
                 CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
      local_b8._0_4_ = 1.0 / (float)(int)uVar20;
      local_180 = (Mat *)0x0;
      do {
        if (0 < (int)local_198) {
          local_178 = (_func_int ***)((long)&local_d8->_vptr_Allocator + local_e0 * (long)local_180)
          ;
          pvVar30 = (void *)(local_d0 * (long)local_180 + (long)local_c8);
          pp_Var1 = this->_vptr_LRN_x86_fma;
          local_190 = (Mat *)0x0;
          do {
            ppp_Var18 = local_178;
            if (0 < local_118) {
              lVar29 = local_c0 * (long)local_190;
              lVar32 = 0;
              do {
                if (local_98._0_4_ == 0) {
                  fVar34 = 0.0;
                }
                else {
                  fVar34 = 0.0;
                  uVar19 = 0;
                  do {
                    fVar34 = fVar34 + *(float *)((long)ppp_Var18 +
                                                (long)piVar12[uVar19] * 4 + lVar32 * 4 + lVar29);
                    uVar19 = uVar19 + 1;
                  } while (uVar20 + (uVar20 == 0) != uVar19);
                }
                auVar38 = vfmadd213ss_fma(ZEXT416((uint)(fVar34 * (float)local_f8._0_4_)),
                                          ZEXT416((uint)local_b8._0_4_),
                                          ZEXT416(*(uint *)(&this->field_0xe0 + (long)pp_Var1[-3])))
                ;
                fVar34 = powf(auVar38._0_4_,-*(float *)(&this->field_0xdc + (long)pp_Var1[-3]));
                *(float *)((long)pvVar30 + lVar32 * 4) =
                     fVar34 * *(float *)((long)pvVar30 + lVar32 * 4);
                lVar32 = lVar32 + 1;
              } while (lVar32 != CONCAT44(iStack_114,local_118));
            }
            pvVar30 = (void *)((long)pvVar30 + local_170 * 4);
            local_190 = (Mat *)((long)&local_190->data + 1);
          } while (local_190 != local_198);
        }
        local_180 = (Mat *)((long)&local_180->data + 1);
      } while (local_180 != local_188);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar10 = (int *)CONCAT44(local_1e8.refcount._4_4_,(int)local_1e8.refcount);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_1e8.data != (Allocator *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elempack = 0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
  }
  iVar15 = 0;
LAB_00345ee1:
  piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,(int)local_168.refcount);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_168.data != (Allocator *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int LRN_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}